

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PushOverrideID(ImGuiID id)

{
  ImGuiWindow *pIVar1;
  ImGuiID id_local;
  
  pIVar1 = GImGui->CurrentWindow;
  id_local = id;
  if (GImGui->DebugHookIdInfo == id) {
    DebugHookIdInfo(id,0xd,(void *)0x0,(void *)0x0);
  }
  ImVector<unsigned_int>::push_back(&pIVar1->IDStack,&id_local);
  return;
}

Assistant:

void ImGui::PushOverrideID(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.DebugHookIdInfo == id)
        DebugHookIdInfo(id, ImGuiDataType_ID, NULL, NULL);
    window->IDStack.push_back(id);
}